

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2_MetadataTest_LibVersionUpdatedCorrectly_Test::TestBody
          (ktxTexture2_MetadataTest_LibVersionUpdatedCorrectly_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int line;
  char *actual_predicate_value;
  undefined8 uVar4;
  Message *pMVar5;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  ktx_uint8_t *newWriterVal;
  ktx_uint32_t newWriterLen;
  AssertionResult gtest_ar_2;
  ktx_uint8_t *newMemFile;
  ktx_size_t newMemFileLen;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__4;
  size_t slash_pos;
  string writer;
  string curWriter;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar;
  ktx_uint8_t *curWriterVal;
  ktx_uint32_t curWriterLen;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ktx_error_code_e result;
  ktxTexture2 *texture;
  char (*in_stack_fffffffffffffb18) [37];
  AssertionResult *in_stack_fffffffffffffb20;
  Message *in_stack_fffffffffffffb28;
  char *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  Message *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  Type type;
  AssertHelper *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb80;
  string *expected_predicate_value;
  char *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  AssertionResult *in_stack_fffffffffffffb98;
  AssertHelper *in_stack_fffffffffffffba0;
  AssertHelper *this_01;
  AssertionResult local_3f8;
  string local_3e8 [55];
  undefined1 local_3b1;
  AssertionResult local_3b0 [2];
  undefined4 local_38c;
  AssertionResult local_388;
  string local_378 [55];
  undefined1 local_341;
  AssertionResult local_340;
  string local_330 [40];
  AssertHelper *local_308;
  undefined1 local_2f1;
  AssertionResult local_2f0;
  string local_2e0 [55];
  undefined1 local_2a9;
  AssertionResult local_2a8;
  long local_298;
  int local_28c [6];
  undefined4 local_274;
  AssertionResult local_270;
  void *local_260;
  undefined8 local_258 [3];
  undefined4 local_23c;
  AssertionResult local_238;
  string local_228 [55];
  undefined1 local_1f1;
  AssertionResult local_1f0;
  long local_1e0;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [55];
  undefined1 local_159;
  AssertionResult local_158 [2];
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper *local_120;
  int local_114;
  string local_110 [55];
  undefined1 local_d9;
  AssertionResult local_d8;
  string local_c8 [40];
  undefined8 local_a0;
  undefined1 local_89;
  AssertionResult local_88;
  uint local_74;
  string local_70 [71];
  undefined1 local_29;
  AssertionResult local_28;
  int local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_14 = ktxTexture2_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),1,local_10
                         );
    local_29 = local_14 == 0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,(type *)0x164819);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_70);
      testing::Message::~Message((Message *)0x1648da);
    }
    local_74 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x164984);
    if (local_74 == 0) {
      local_89 = local_10[0] != 0;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,(type *)0x1649c4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)
        ;
        local_a0 = ktxErrorString(local_14);
        testing::Message::operator<<
                  ((Message *)in_stack_fffffffffffffb20,(char **)in_stack_fffffffffffffb18);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffb98,
                   (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                   in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string(local_c8);
        testing::Message::~Message((Message *)0x164afa);
      }
      local_74 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x164ba4);
      if (local_74 == 0) {
        local_d9 = *(long *)(local_10[0] + 0x70) != 0;
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,(type *)0x164be8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb50);
          testing::Message::operator<<
                    ((Message *)in_stack_fffffffffffffb20,(char (*) [22])in_stack_fffffffffffffb18);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_fffffffffffffb98,
                     (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                     in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                     in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
          std::__cxx11::string::~string(local_110);
          testing::Message::~Message((Message *)0x164cd9);
        }
        local_74 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x164d86);
        if (local_74 == 0) {
          local_14 = ktxHashList_FindValue(local_10[0] + 0x50,"KTXwriter",&local_114,&local_120);
          local_134 = 0;
          testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                    ((char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     in_stack_fffffffffffffb30,(ktx_error_code_e *)in_stack_fffffffffffffb28,
                     (ktx_error_code_e *)in_stack_fffffffffffffb20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffb50);
            testing::AssertionResult::failure_message((AssertionResult *)0x164e43);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffb20);
            testing::Message::~Message((Message *)0x164ea6);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x164f14);
          local_159 = *(char *)((long)&local_120->data_ + (ulong)(local_114 - 1)) == '\0';
          testing::AssertionResult::AssertionResult<bool>
                    (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,(type *)0x164f54);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffb50);
            testing::Message::operator<<
                      ((Message *)in_stack_fffffffffffffb20,(char (*) [29])in_stack_fffffffffffffb18
                      );
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffffb98,
                       (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffb20);
            std::__cxx11::string::~string(local_190);
            testing::Message::~Message((Message *)0x165045);
          }
          local_74 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1650f2);
          if (local_74 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1b0,(char *)local_120,(ulong)(local_114 - 1),&local_1b1);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
            std::__cxx11::string::string(local_1d8,local_1b0);
            local_1e0 = std::__cxx11::string::find_last_of((char)local_1d8,0x2f);
            local_1f1 = local_1e0 != -1;
            testing::AssertionResult::AssertionResult<bool>
                      (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,(type *)0x1651d3)
            ;
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
            this_01 = local_120;
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffb50);
              in_stack_fffffffffffffb98 =
                   (AssertionResult *)
                   testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (in_stack_fffffffffffffb98,
                         (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                         in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
              std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                         in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
              testing::internal::AssertHelper::operator=
                        (local_120,(Message *)in_stack_fffffffffffffb98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffb20);
              std::__cxx11::string::~string(local_228);
              testing::Message::~Message((Message *)0x16531e);
              this_01 = local_120;
            }
            local_74 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1653cb);
            if (local_74 == 0) {
              std::__cxx11::string::replace
                        ((ulong)local_1d8,local_1e0 + 2,(char *)0xffffffffffffffff);
              actual_predicate_value = (char *)(local_10[0] + 0x50);
              expected_predicate_value = local_1d8;
              uVar2 = std::__cxx11::string::length();
              uVar4 = std::__cxx11::string::c_str();
              uVar3 = ktxHashList_AddKVPair(actual_predicate_value,"KTXwriter",uVar2,uVar4);
              local_23c = 0;
              local_14 = uVar3;
              testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                        ((char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         in_stack_fffffffffffffb30,(ktx_error_code_e *)in_stack_fffffffffffffb28,
                         (ktx_error_code_e *)in_stack_fffffffffffffb20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                testing::AssertionResult::failure_message((AssertionResult *)0x1654dd);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                           in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
                testing::internal::AssertHelper::operator=
                          (this_01,(Message *)in_stack_fffffffffffffb98);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffb20);
                testing::Message::~Message((Message *)0x16553a);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1655ab);
              local_14 = (**(code **)(*(long *)(local_10[0] + 8) + 0x68))
                                   (local_10[0],&local_260,local_258);
              local_274 = 0;
              testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                        ((char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         in_stack_fffffffffffffb30,(ktx_error_code_e *)in_stack_fffffffffffffb28,
                         (ktx_error_code_e *)in_stack_fffffffffffffb20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                testing::AssertionResult::failure_message((AssertionResult *)0x16565c);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                           in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
                testing::internal::AssertHelper::operator=
                          (this_01,(Message *)in_stack_fffffffffffffb98);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffb20);
                testing::Message::~Message((Message *)0x1656b9);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x165724);
              if (local_10[0] != 0) {
                (*(code *)**(undefined8 **)(local_10[0] + 8))();
              }
              local_14 = ktxTexture2_CreateFromMemory(local_260,local_258[0],1,local_10);
              local_2a9 = local_14 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
                         (type *)0x1657b3);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (in_stack_fffffffffffffb98,(char *)CONCAT44(uVar3,uVar2),
                           actual_predicate_value,(char *)expected_predicate_value);
                std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                           in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
                testing::internal::AssertHelper::operator=
                          (this_01,(Message *)in_stack_fffffffffffffb98);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffb20);
                std::__cxx11::string::~string(local_2e0);
                testing::Message::~Message((Message *)0x165876);
              }
              local_74 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x165920);
              if (local_74 == 0) {
                local_2f1 = local_10[0] != 0;
                testing::AssertionResult::AssertionResult<bool>
                          (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
                           (type *)0x16595d);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
                  in_stack_fffffffffffffb50 = (AssertHelper *)ktxErrorString(local_14);
                  local_308 = in_stack_fffffffffffffb50;
                  pMVar5 = testing::Message::operator<<
                                     ((Message *)in_stack_fffffffffffffb20,
                                      (char **)in_stack_fffffffffffffb18);
                  type = (Type)((ulong)pMVar5 >> 0x20);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (in_stack_fffffffffffffb98,(char *)CONCAT44(uVar3,uVar2),
                             actual_predicate_value,(char *)expected_predicate_value);
                  std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                             in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
                  testing::internal::AssertHelper::operator=
                            (this_01,(Message *)in_stack_fffffffffffffb98);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffb20);
                  std::__cxx11::string::~string(local_330);
                  testing::Message::~Message((Message *)0x165a83);
                }
                local_74 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x165b2d);
                if (local_74 == 0) {
                  local_341 = *(long *)(local_10[0] + 0x70) != 0;
                  testing::AssertionResult::AssertionResult<bool>
                            (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
                             (type *)0x165b6e);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                    in_stack_fffffffffffffb40 =
                         testing::Message::operator<<
                                   ((Message *)in_stack_fffffffffffffb20,
                                    (char (*) [22])in_stack_fffffffffffffb18);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (in_stack_fffffffffffffb98,(char *)CONCAT44(uVar3,uVar2),
                               actual_predicate_value,(char *)expected_predicate_value);
                    std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                               in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
                    testing::internal::AssertHelper::operator=
                              (this_01,(Message *)in_stack_fffffffffffffb98);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffffb20);
                    std::__cxx11::string::~string(local_378);
                    testing::Message::~Message((Message *)0x165c5b);
                  }
                  local_74 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x165d08);
                  if (local_74 == 0) {
                    line = ktxHashList_FindValue
                                     (local_10[0] + 0x50,"KTXwriter",local_28c,&local_298);
                    local_38c = 0;
                    local_14 = line;
                    testing::internal::EqHelper::
                    Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                              ((char *)CONCAT44(line,in_stack_fffffffffffffb38),
                               in_stack_fffffffffffffb30,
                               (ktx_error_code_e *)in_stack_fffffffffffffb28,
                               (ktx_error_code_e *)in_stack_fffffffffffffb20);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                      in_stack_fffffffffffffb30 =
                           testing::AssertionResult::failure_message((AssertionResult *)0x165dd0);
                      testing::internal::AssertHelper::AssertHelper
                                (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                                 line,in_stack_fffffffffffffb30);
                      testing::internal::AssertHelper::operator=
                                (this_01,(Message *)in_stack_fffffffffffffb98);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffffb20);
                      testing::Message::~Message((Message *)0x165e2d);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x165e9b);
                    local_3b1 = *(char *)(local_298 + (ulong)(local_28c[0] - 1)) == '\0';
                    testing::AssertionResult::AssertionResult<bool>
                              (in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
                               (type *)0x165ed2);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                      in_stack_fffffffffffffb28 =
                           testing::Message::operator<<
                                     ((Message *)in_stack_fffffffffffffb20,
                                      (char (*) [29])in_stack_fffffffffffffb18);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (in_stack_fffffffffffffb98,(char *)CONCAT44(uVar3,uVar2),
                                 actual_predicate_value,(char *)expected_predicate_value);
                      std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                                 line,in_stack_fffffffffffffb30);
                      testing::internal::AssertHelper::operator=
                                (this_01,(Message *)in_stack_fffffffffffffb98);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)in_stack_fffffffffffffb20);
                      std::__cxx11::string::~string(local_3e8);
                      testing::Message::~Message((Message *)0x165fbf);
                    }
                    local_74 = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x16606c);
                    if (local_74 == 0) {
                      std::__cxx11::string::compare((char *)local_1b0);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((char *)CONCAT44(line,in_stack_fffffffffffffb38),
                                 in_stack_fffffffffffffb30,(int *)in_stack_fffffffffffffb28,
                                 (int *)in_stack_fffffffffffffb20);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
                      if (!bVar1) {
                        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
                        this_00 = (AssertHelper *)
                                  testing::AssertionResult::failure_message
                                            ((AssertionResult *)0x166117);
                        testing::internal::AssertHelper::AssertHelper
                                  (in_stack_fffffffffffffb50,type,(char *)in_stack_fffffffffffffb40,
                                   line,in_stack_fffffffffffffb30);
                        testing::internal::AssertHelper::operator=
                                  (this_01,(Message *)in_stack_fffffffffffffb98);
                        testing::internal::AssertHelper::~AssertHelper(this_00);
                        testing::Message::~Message((Message *)0x166174);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1661df);
                      if (local_10[0] != 0) {
                        (*(code *)**(undefined8 **)(local_10[0] + 8))();
                      }
                      if (local_260 != (void *)0x0) {
                        free(local_260);
                      }
                      local_74 = 0;
                    }
                  }
                }
              }
            }
            std::__cxx11::string::~string(local_1d8);
            std::__cxx11::string::~string(local_1b0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture2_MetadataTest, LibVersionUpdatedCorrectly) {
    ktxTexture2* texture;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        ktx_uint32_t curWriterLen;
        ktx_uint8_t* curWriterVal;
        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       "KTXwriter",
                                        &curWriterLen, (void**)&curWriterVal);
        EXPECT_EQ(result, KTX_SUCCESS);
        // We want ktxWriteTo* to NUL terminate the value when adding
        // the libktx version.
        ASSERT_TRUE(curWriterVal[curWriterLen-1] == '\0')
                    << "KTXwriter not NUL terminated";
        // The pointer returned by FindValue becomes invalid when the texture
        // is destroyed hence saving to this string. -1 to omit the terminator.
        std::string curWriter((char*)curWriterVal, curWriterLen-1);
        std::string writer(curWriter);
        size_t slash_pos = writer.find_last_of('/');
        ASSERT_TRUE(slash_pos != std::string::npos)
                    << "KTXwriter does not have lib version.";
        writer.replace(slash_pos + 2, std::string::npos, "libktx v3.0.0");
        result = ktxHashList_AddKVPair(&texture->kvDataHead,
                                       "KTXwriter",
                                       (ktx_uint32_t)writer.length(),
                                       writer.c_str());
        EXPECT_EQ(result, KTX_SUCCESS);


        ktx_size_t newMemFileLen;
        ktx_uint8_t* newMemFile;
        result = ktxTexture_WriteToMemory(ktxTexture(texture),
                                          &newMemFile,
                                          &newMemFileLen);
        EXPECT_EQ(result, KTX_SUCCESS);

        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));

        ktx_uint32_t newWriterLen;
        ktx_uint8_t* newWriterVal;
        result = ktxTexture2_CreateFromMemory(newMemFile,
                                              newMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       "KTXwriter",
                                        &newWriterLen, (void**)&newWriterVal);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(newWriterVal[newWriterLen-1] == '\0')
                    << "KTXwriter not NUL terminated";

        EXPECT_EQ(0, curWriter.compare((char *)newWriterVal));

        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));

        if (newMemFile)
            free(newMemFile);
    }
}